

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool libtorrent::anon_unknown_1::extract_files2
               (bdecode_node *tree,file_storage *target,string *root_dir,ptrdiff_t info_offset,
               char *info_buffer,bool has_files,int depth,error_code *ec)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  type_t tVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ptrdiff_t pVar6;
  const_reference pvVar7;
  size_type sVar8;
  ulong uVar9;
  char *pcVar10;
  bool bVar11;
  string_view sVar12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view name;
  int in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4c;
  byte in_stack_fffffffffffffd4d;
  undefined1 in_stack_fffffffffffffd4e;
  bool local_291;
  bool local_28b;
  bool local_289;
  bool local_24d;
  undefined1 local_230 [80];
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  string *local_1d0;
  size_t local_1c8;
  byte local_1b9;
  string local_1b8 [32];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_198;
  string *local_188;
  size_t sStack_180;
  undefined1 local_170 [8];
  string path;
  undefined1 local_148 [6];
  bool single_file;
  bool local_f1;
  undefined1 auStack_f0 [7];
  bool leaf_node;
  string_view filename;
  string_view local_d0;
  undefined1 local_c0 [8];
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> e;
  int i;
  bool has_files_local;
  char *info_buffer_local;
  ptrdiff_t info_offset_local;
  string *root_dir_local;
  file_storage *target_local;
  bdecode_node *tree_local;
  
  e.second._63_1_ = has_files;
  tVar2 = bdecode_node::type(tree);
  if (tVar2 == dict_t) {
    if (depth < 0x65) {
      e.second.m_size = 0;
      while( true ) {
        iVar4 = e.second.m_size;
        iVar3 = bdecode_node::dict_size(tree);
        if (iVar3 <= iVar4) break;
        bdecode_node::dict_at_node
                  ((pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> *)local_c0,tree,
                   e.second.m_size);
        tVar2 = bdecode_node::type((bdecode_node *)&e.first.m_size);
        local_24d = true;
        if (tVar2 == dict_t) {
          sVar12 = bdecode_node::string_value((bdecode_node *)local_c0);
          local_d0 = sVar12;
          local_24d = ::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_d0);
        }
        if (local_24d == false) {
          pVar6 = bdecode_node::string_offset((bdecode_node *)local_c0);
          iVar4 = bdecode_node::string_length((bdecode_node *)local_c0);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f0,
                     info_buffer + (pVar6 - info_offset),(long)iVar4);
          while( true ) {
            bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f0);
            bVar11 = false;
            if (!bVar1) {
              pvVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                                 ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f0);
              bVar11 = *pvVar7 == '/';
            }
            if (!bVar11) break;
            ::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f0,1);
          }
          path.field_2._M_local_buf[0xf] = '\0';
          uVar5 = bdecode_node::dict_size((bdecode_node *)&e.first.m_size);
          pcVar10 = (char *)(ulong)uVar5;
          local_289 = false;
          if (uVar5 == 1) {
            bdecode_node::dict_at
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                        *)local_148,(bdecode_node *)&e.first.m_size,0);
            path.field_2._M_local_buf[0xf] = '\x01';
            local_289 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_148);
          }
          if ((path.field_2._M_local_buf[0xf] & 1U) != 0) {
            ::std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
            ~pair((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                   *)local_148);
          }
          local_f1 = local_289;
          local_28b = false;
          if ((local_289 != false) && (local_28b = false, (e.second._63_1_ & 1) == 0)) {
            iVar4 = bdecode_node::dict_size(tree);
            local_28b = iVar4 == 1;
          }
          path.field_2._M_local_buf[0xe] = local_28b;
          if (local_28b == false) {
            ::std::__cxx11::string::string((string *)local_170,(string *)root_dir);
          }
          else {
            ::std::__cxx11::string::string((string *)local_170);
          }
          local_188 = _auStack_f0;
          sStack_180 = filename._M_len;
          sVar12._M_str = pcVar10;
          sVar12._M_len = filename._M_len;
          libtorrent::aux::sanitize_append_path_element((aux *)local_170,_auStack_f0,sVar12);
          if ((local_f1 & 1U) == 0) {
            in_stack_fffffffffffffd4c =
                 extract_files2((bdecode_node *)&e.first.m_size,target,(string *)local_170,
                                info_offset,info_buffer,true,depth + 1,ec);
            if ((bool)in_stack_fffffffffffffd4c) {
              filename._M_str._0_4_ = 0;
            }
            else {
              tree_local._7_1_ = 0;
              filename._M_str._0_4_ = 1;
            }
          }
          else {
            sVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f0);
            uVar9 = ::std::__cxx11::string::length();
            local_1b9 = 0;
            local_291 = true;
            if (sVar8 <= uVar9) {
              ::std::__cxx11::string::size();
              ::std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f0);
              ::std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_170);
              local_1b9 = 1;
              __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    ::std::__cxx11::string::operator_cast_to_basic_string_view(local_1b8);
              local_1d0 = _auStack_f0;
              local_1c8 = filename._M_len;
              __y._M_str = (char *)filename._M_len;
              __y._M_len = (size_t)_auStack_f0;
              local_198 = __x;
              local_291 = ::std::operator!=(__x,__y);
            }
            if ((local_1b9 & 1) != 0) {
              ::std::__cxx11::string::~string(local_1b8);
            }
            if ((local_291 & 1U) != 0) {
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0)
              ;
              _auStack_f0 = (string *)local_1e0._M_len;
              filename._M_len = (size_t)local_1e0._M_str;
            }
            bdecode_node::dict_at
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                        *)local_230,(bdecode_node *)&e.first.m_size,0);
            name._M_str = (char *)info_offset;
            name._M_len = filename._M_len;
            in_stack_fffffffffffffd4e =
                 extract_single_file2
                           ((anon_unknown_1 *)(local_230 + 0x10),(bdecode_node *)target,
                            (file_storage *)local_170,_auStack_f0,name,(ptrdiff_t)info_buffer,
                            (char *)ec,
                            (error_code *)
                            CONCAT17(local_291,
                                     CONCAT16(in_stack_fffffffffffffd4e,
                                              CONCAT15(in_stack_fffffffffffffd4d,
                                                       CONCAT14(in_stack_fffffffffffffd4c,
                                                                in_stack_fffffffffffffd48)))));
            in_stack_fffffffffffffd4d = in_stack_fffffffffffffd4e ^ 0xff;
            ::std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
            ~pair((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                   *)local_230);
            if ((in_stack_fffffffffffffd4d & 1) == 0) {
              filename._M_str._0_4_ = 4;
            }
            else {
              tree_local._7_1_ = 0;
              filename._M_str._0_4_ = 1;
            }
          }
          ::std::__cxx11::string::~string((string *)local_170);
        }
        else {
          boost::system::error_code::operator=(ec,torrent_file_parse_failed);
          tree_local._7_1_ = 0;
          filename._M_str._0_4_ = 1;
        }
        ::std::pair<libtorrent::bdecode_node,_libtorrent::bdecode_node>::~pair
                  ((pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> *)local_c0);
        if (((int)filename._M_str != 0) && ((int)filename._M_str == 1)) goto LAB_0073c0c0;
        e.second.m_size = e.second.m_size + 1;
        in_stack_fffffffffffffd48 = (int)filename._M_str;
      }
      tree_local._7_1_ = 1;
    }
    else {
      boost::system::error_code::operator=(ec,torrent_file_parse_failed);
      tree_local._7_1_ = 0;
    }
  }
  else {
    boost::system::error_code::operator=(ec,torrent_file_parse_failed);
    tree_local._7_1_ = 0;
  }
LAB_0073c0c0:
  return (bool)(tree_local._7_1_ & 1);
}

Assistant:

bool extract_files2(bdecode_node const& tree, file_storage& target
		, std::string const& root_dir, ptrdiff_t const info_offset
		, char const* info_buffer
		, bool const has_files, int const depth, error_code& ec)
	{
		if (tree.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		// since we're parsing this recursively, we have to be careful not to blow
		// up the stack. 100 levels of sub directories should be enough. This
		// could be improved by an iterative parser, keeping the state on a more
		// compact side-stack
		if (depth > 100)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		for (int i = 0; i < tree.dict_size(); ++i)
		{
			auto e = tree.dict_at_node(i);
			if (e.second.type() != bdecode_node::dict_t || e.first.string_value().empty())
			{
				ec = errors::torrent_file_parse_failed;
				return false;
			}

			string_view filename = { info_buffer + (e.first.string_offset() - info_offset)
				, static_cast<size_t>(e.first.string_length()) };
			while (!filename.empty() && filename.front() == TORRENT_SEPARATOR)
				filename.remove_prefix(1);

			bool const leaf_node = e.second.dict_size() == 1 && e.second.dict_at(0).first.empty();
			bool const single_file = leaf_node && !has_files && tree.dict_size() == 1;

			std::string path = single_file ? std::string() : root_dir;
			aux::sanitize_append_path_element(path, filename);

			if (leaf_node)
			{
				if (filename.size() > path.length()
					|| path.substr(path.size() - filename.size()) != filename)
				{
					// if the filename was sanitized and differ, clear it to just use path
					filename = {};
				}

				if (!extract_single_file2(e.second.dict_at(0).second, target
					, path, filename, info_offset, info_buffer, ec))
				{
					return false;
				}
				continue;
			}

			if (!extract_files2(e.second, target, path, info_offset, info_buffer
				, true, depth + 1, ec))
			{
				return false;
			}
		}

		return true;
	}